

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void FunctionalTester<unsigned_long_long,_void>::Test(void)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char buf1 [64];
  char buf2 [64];
  TestWatcher<unsigned_long_long> local_19 [8];
  TestWatcher<unsigned_long_long> tw;
  
  TestWatcher<unsigned_long_long>::TestWatcher(local_19);
  uStack_a8 = CONCAT22(uStack_a8._2_2_,0x30);
  __s = buf1 + 0x38;
  sprintf(__s,"%llu",0);
  iVar1 = strcmp((char *)&uStack_a8,__s);
  if (iVar1 == 0) {
    uStack_a8 = 0x34343831;
    uStack_a4 = 0x34343736;
    builtin_strncpy(buf1,"073709551615",0xd);
    sprintf(__s,"%llu",0xffffffffffffffff);
    iVar1 = strcmp((char *)&uStack_a8,__s);
    if (iVar1 == 0) {
      TestWatcher<unsigned_long_long>::~TestWatcher(local_19);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
    sVar2 = strlen((char *)&uStack_a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)&uStack_a8,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
    sVar2 = strlen(buf1 + 0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,buf1 + 0x38,sVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
    sVar2 = strlen((char *)&uStack_a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)&uStack_a8,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
    sVar2 = strlen(buf1 + 0x38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,buf1 + 0x38,sVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(1);
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        char buf1[64];
        char buf2[64];
        int2str::convert_with_zero(std::numeric_limits<T>::min(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::min());
        StrcmpAndExit(buf1, buf2);
        int2str::convert_with_zero(std::numeric_limits<T>::max(), buf1);
        sprintf(buf2, PrintfFormat<T>(), std::numeric_limits<T>::max());
        StrcmpAndExit(buf1, buf2);
    }